

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O1

void __thiscall
OpenMD::SelectionEvaluator::compareProperty
          (SelectionEvaluator *this,Molecule *mol,SelectionSet *bs,int property,int comparator,
          float comparisonValue,int frame)

{
  ulong *puVar1;
  double dVar2;
  SnapshotManager *pSVar3;
  RealType RVar4;
  uint i;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar7;
  ulong uVar8;
  Atom *atom;
  pointer ppAVar9;
  bool bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Vector3d pos;
  Vector3d local_60;
  Vector3d local_48;
  
  local_48.super_Vector<double,_3U>.data_[0] = 0.0;
  local_48.super_Vector<double,_3U>.data_[1] = 0.0;
  local_48.super_Vector<double,_3U>.data_[2] = 0.0;
  switch(property) {
  case 0x1c00:
    RVar4 = Molecule::getMass(mol);
    uVar11 = SUB84(RVar4,0);
    uVar12 = (undefined4)((ulong)RVar4 >> 0x20);
LAB_002674e0:
    local_60.super_Vector<double,_3U>.data_[2] = (double)CONCAT44(uVar12,uVar11);
    break;
  case 0x1c01:
    ppAVar9 = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar9 ==
        (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      atom = (Atom *)0x0;
    }
    else {
      atom = *ppAVar9;
    }
    if (atom == (Atom *)0x0) goto LAB_00267524;
    local_60.super_Vector<double,_3U>.data_[2] = 0.0;
    do {
      ppAVar9 = ppAVar9 + 1;
      RVar4 = getCharge(this,atom,frame);
      if (ppAVar9 ==
          (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        atom = (Atom *)0x0;
      }
      else {
        atom = *ppAVar9;
      }
      local_60.super_Vector<double,_3U>.data_[2] =
           local_60.super_Vector<double,_3U>.data_[2] + RVar4;
    } while (atom != (Atom *)0x0);
    break;
  case 0x1c02:
    Molecule::getCom(&local_60,mol,frame);
    local_60.super_Vector<double,_3U>.data_[2] =
         (double)CONCAT44(local_60.super_Vector<double,_3U>.data_[0]._4_4_,
                          local_60.super_Vector<double,_3U>.data_[0]._0_4_);
    break;
  case 0x1c03:
    Molecule::getCom(&local_60,mol,frame);
    local_60.super_Vector<double,_3U>.data_[2] =
         (double)CONCAT44(local_60.super_Vector<double,_3U>.data_[1]._4_4_,
                          local_60.super_Vector<double,_3U>.data_[1]._0_4_);
    break;
  case 0x1c04:
    Molecule::getCom(&local_60,mol,frame);
    break;
  case 0x1c05:
    Molecule::getCom(&local_60,mol,frame);
    local_60.super_Vector<double,_3U>.data_[2] = 0.0;
    lVar6 = 0;
    do {
      dVar2 = local_60.super_Vector<double,_3U>.data_[lVar6];
      local_60.super_Vector<double,_3U>.data_[2] =
           local_60.super_Vector<double,_3U>.data_[2] + dVar2 * dVar2;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    if (local_60.super_Vector<double,_3U>.data_[2] < 0.0) {
      dVar2 = sqrt(local_60.super_Vector<double,_3U>.data_[2]);
      uVar11 = SUB84(dVar2,0);
      uVar12 = (undefined4)((ulong)dVar2 >> 0x20);
      goto LAB_002674e0;
    }
    local_60.super_Vector<double,_3U>.data_[2] = SQRT(local_60.super_Vector<double,_3U>.data_[2]);
    break;
  case 0x1c06:
    Molecule::getCom(&local_60,mol,frame);
    local_48.super_Vector<double,_3U>.data_[2] = local_60.super_Vector<double,_3U>.data_[2];
    local_48.super_Vector<double,_3U>.data_[0] =
         (double)CONCAT44(local_60.super_Vector<double,_3U>.data_[0]._4_4_,
                          local_60.super_Vector<double,_3U>.data_[0]._0_4_);
    pSVar3 = this->info->sman_;
    iVar5 = (*pSVar3->_vptr_SnapshotManager[4])(pSVar3,(ulong)(uint)frame);
    Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_00,iVar5),&local_48);
    local_60.super_Vector<double,_3U>.data_[2] = local_48.super_Vector<double,_3U>.data_[0];
    break;
  case 0x1c07:
    Molecule::getCom(&local_60,mol,frame);
    local_48.super_Vector<double,_3U>.data_[2] = local_60.super_Vector<double,_3U>.data_[2];
    local_48.super_Vector<double,_3U>.data_[1]._0_4_ =
         local_60.super_Vector<double,_3U>.data_[1]._0_4_;
    local_48.super_Vector<double,_3U>.data_[1]._4_4_ =
         local_60.super_Vector<double,_3U>.data_[1]._4_4_;
    pSVar3 = this->info->sman_;
    iVar5 = (*pSVar3->_vptr_SnapshotManager[4])(pSVar3,(ulong)(uint)frame);
    Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var,iVar5),&local_48);
    goto LAB_002674c8;
  case 0x1c08:
    Molecule::getCom(&local_60,mol,frame);
    local_48.super_Vector<double,_3U>.data_[2] = local_60.super_Vector<double,_3U>.data_[2];
    pSVar3 = this->info->sman_;
    iVar5 = (*pSVar3->_vptr_SnapshotManager[4])(pSVar3,(ulong)(uint)frame);
    Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_01,iVar5),&local_48);
    local_48.super_Vector<double,_3U>.data_[1]._0_4_ =
         SUB84(local_48.super_Vector<double,_3U>.data_[2],0);
    local_48.super_Vector<double,_3U>.data_[1]._4_4_ =
         (undefined4)((ulong)local_48.super_Vector<double,_3U>.data_[2] >> 0x20);
LAB_002674c8:
    local_60.super_Vector<double,_3U>.data_[2] =
         (double)CONCAT44(local_48.super_Vector<double,_3U>.data_[1]._4_4_,
                          local_48.super_Vector<double,_3U>.data_[1]._0_4_);
    break;
  default:
    unrecognizedMoleculeProperty(this,property);
LAB_00267524:
    local_60.super_Vector<double,_3U>.data_[2] = 0.0;
  }
  switch(comparator) {
  case 0x3400:
    bVar10 = local_60.super_Vector<double,_3U>.data_[2] < (double)comparisonValue;
    break;
  case 0x3401:
    bVar10 = local_60.super_Vector<double,_3U>.data_[2] < (double)comparisonValue;
    goto LAB_002675a5;
  case 0x3402:
    dVar2 = (double)comparisonValue;
    goto LAB_00267580;
  case 0x3403:
    bVar10 = (double)comparisonValue < local_60.super_Vector<double,_3U>.data_[2];
    break;
  case 0x3404:
    local_60.super_Vector<double,_3U>.data_[2] =
         ABS(local_60.super_Vector<double,_3U>.data_[2] - (double)comparisonValue);
    dVar2 = 1e-06;
LAB_00267580:
    bVar10 = dVar2 < local_60.super_Vector<double,_3U>.data_[2];
LAB_002675a5:
    bVar10 = !bVar10;
    goto LAB_002675c0;
  case 0x3405:
    bVar10 = local_60.super_Vector<double,_3U>.data_[2] != (double)comparisonValue;
    goto LAB_002675c0;
  default:
    goto switchD_00267547_default;
  }
  bVar10 = !bVar10 && (double)comparisonValue != local_60.super_Vector<double,_3U>.data_[2];
LAB_002675c0:
  if (bVar10) {
    uVar7 = (ulong)mol->globalIndex_;
    uVar8 = uVar7 + 0x3f;
    if (-1 < (long)uVar7) {
      uVar8 = uVar7;
    }
    puVar1 = (ulong *)(((long)uVar8 >> 6) * 8 +
                       *(long *)&(bs->bitsets_).
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start[5].bitset_.
                                 super__Bvector_base<std::allocator<bool>_> + -8 +
                      (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) * 8);
    *puVar1 = *puVar1 | 1L << ((byte)mol->globalIndex_ & 0x3f);
  }
switchD_00267547_default:
  return;
}

Assistant:

void SelectionEvaluator::compareProperty(Molecule* mol, SelectionSet& bs,
                                           int property, int comparator,
                                           float comparisonValue, int frame) {
    RealType propertyValue = 0.0;
    Vector3d pos;
    switch (property) {
    case Token::mass:
      propertyValue = mol->getMass();
      break;
    case Token::charge: {
      Molecule::AtomIterator ai;
      Atom* atom;
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        propertyValue += getCharge(atom, frame);
      }
    } break;
    case Token::x:
      propertyValue = mol->getCom(frame).x();
      break;
    case Token::y:
      propertyValue = mol->getCom(frame).y();
      break;
    case Token::z:
      propertyValue = mol->getCom(frame).z();
      break;
    case Token::wrappedX:
      pos = mol->getCom(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.x();
      break;
    case Token::wrappedY:
      pos = mol->getCom(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.y();
      break;
    case Token::wrappedZ:
      pos = mol->getCom(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.z();
      break;

    case Token::r:
      propertyValue = mol->getCom(frame).length();
      break;
    default:
      unrecognizedMoleculeProperty(property);
    }

    bool match = false;
    switch (comparator) {
    case Token::opLT:
      match = propertyValue < comparisonValue;
      break;
    case Token::opLE:
      match = propertyValue <= comparisonValue;
      break;
    case Token::opGE:
      match = propertyValue >= comparisonValue;
      break;
    case Token::opGT:
      match = propertyValue > comparisonValue;
      break;
    case Token::opEQ:
      match = fabs(propertyValue - comparisonValue) <= OpenMD::epsilon;
      break;
    case Token::opNE:
      match = propertyValue != comparisonValue;
      break;
    }
    if (match) bs.bitsets_[MOLECULE].setBitOn(mol->getGlobalIndex());
  }